

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O1

sysbvm_tuple_t sysbvm_stackFrame_buildStackTraceUpTo(sysbvm_stackFrameRecord_t *targetRecord)

{
  sysbvm_context_t *context;
  sysbvm_tuple_t orderedCollection;
  sysbvm_tuple_t sVar1;
  sysbvm_stackFrameBytecodeFunctionActivationRecord_t *activationRecord;
  long in_FS_OFFSET;
  
  context = *(sysbvm_context_t **)(in_FS_OFFSET + -0x18);
  orderedCollection = sysbvm_orderedCollection_create(context);
  activationRecord = *(sysbvm_stackFrameBytecodeFunctionActivationRecord_t **)(in_FS_OFFSET + -0x10)
  ;
  sVar1 = 0;
  if (activationRecord != (sysbvm_stackFrameBytecodeFunctionActivationRecord_t *)targetRecord &&
      activationRecord != (sysbvm_stackFrameBytecodeFunctionActivationRecord_t *)0x0) {
    do {
      switch(activationRecord->type) {
      case SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION:
        break;
      case SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION:
        if (sVar1 != 0) {
          sysbvm_orderedCollection_add(context,orderedCollection,sVar1);
        }
        sVar1 = sysbvm_bytecodeInterpreter_getSourcePositionForActivationRecord
                          (context,activationRecord);
        break;
      case SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION:
        if (sVar1 != 0) {
          sysbvm_orderedCollection_add(context,orderedCollection,sVar1);
        }
        sVar1 = sysbvm_bytecodeInterpreter_getSourcePositionForJitActivationRecord
                          (context,(sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t *)
                                   activationRecord);
        break;
      default:
        goto switchD_0013772c_caseD_4;
      case SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION:
        if (sVar1 == 0) {
          sVar1 = activationRecord->function;
        }
        goto switchD_0013772c_caseD_4;
      }
      if (sVar1 != 0) {
        sysbvm_orderedCollection_add(context,orderedCollection,sVar1);
      }
      sVar1 = 0;
switchD_0013772c_caseD_4:
      activationRecord =
           (sysbvm_stackFrameBytecodeFunctionActivationRecord_t *)activationRecord->previous;
    } while ((activationRecord != (sysbvm_stackFrameBytecodeFunctionActivationRecord_t *)0x0) &&
            (activationRecord != (sysbvm_stackFrameBytecodeFunctionActivationRecord_t *)targetRecord
            ));
  }
  if (sVar1 != 0) {
    sysbvm_orderedCollection_add(context,orderedCollection,sVar1);
  }
  sVar1 = sysbvm_orderedCollection_asArray(context,orderedCollection);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_stackFrame_buildStackTraceUpTo(sysbvm_stackFrameRecord_t *targetRecord)
{
    sysbvm_context_t *context = sysbvm_stackFrame_activeContext;
    sysbvm_tuple_t orderedCollection = sysbvm_orderedCollection_create(context);
    
    sysbvm_stackFrameRecord_t *stackFrameRecord = sysbvm_stackFrame_activeRecord;
    //sysbvm_tuple_t currentFunction = SYSBVM_NULL_TUPLE;
    sysbvm_tuple_t currentSourcePosition = SYSBVM_NULL_TUPLE;
    while(stackFrameRecord && stackFrameRecord != targetRecord)
    {
        if(stackFrameRecord->type == SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION)
        {
            if(!currentSourcePosition)
                currentSourcePosition = ((sysbvm_stackFrameSourcePositionRecord_t*)stackFrameRecord)->sourcePosition;
        }
        else if(stackFrameRecord->type == SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION)
        {
            if(currentSourcePosition)
            {
                sysbvm_orderedCollection_add(context, orderedCollection, currentSourcePosition);
                currentSourcePosition = SYSBVM_NULL_TUPLE;
            }
            //currentFunction = ((sysbvm_stackFrameFunctionActivationRecord_t*)stackFrameRecord)->function;
        }
        else if(stackFrameRecord->type == SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION)
        {
            if(currentSourcePosition)
                sysbvm_orderedCollection_add(context, orderedCollection, currentSourcePosition);
            currentSourcePosition = sysbvm_bytecodeInterpreter_getSourcePositionForActivationRecord(context, (sysbvm_stackFrameBytecodeFunctionActivationRecord_t*)stackFrameRecord);
            if(currentSourcePosition)
                sysbvm_orderedCollection_add(context, orderedCollection, currentSourcePosition);
            currentSourcePosition = SYSBVM_NULL_TUPLE;
        }
        else if(stackFrameRecord->type == SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION)
        {
            if(currentSourcePosition)
                sysbvm_orderedCollection_add(context, orderedCollection, currentSourcePosition);
            currentSourcePosition = sysbvm_bytecodeInterpreter_getSourcePositionForJitActivationRecord(context, (sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t*)stackFrameRecord);
            if(currentSourcePosition)
                sysbvm_orderedCollection_add(context, orderedCollection, currentSourcePosition);
            currentSourcePosition = SYSBVM_NULL_TUPLE;
        }

        stackFrameRecord = stackFrameRecord->previous;
    }

    if(currentSourcePosition)
        sysbvm_orderedCollection_add(context, orderedCollection, currentSourcePosition);

    return sysbvm_orderedCollection_asArray(context, orderedCollection);
}